

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

string * __thiscall
spirv_cross::ParsedIR::get_member_name_abi_cxx11_(ParsedIR *this,TypeID id,uint32_t index)

{
  ulong uVar1;
  size_t sVar2;
  ID local_34;
  Meta *local_30;
  Meta *m;
  ParsedIR *pPStack_20;
  uint32_t index_local;
  ParsedIR *this_local;
  Decoration *pDStack_10;
  TypeID id_local;
  
  m._4_4_ = index;
  pPStack_20 = this;
  this_local._4_4_ = id.id;
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
            (&local_34,(TypedID<(spirv_cross::Types)1> *)((long)&this_local + 4));
  local_30 = find_meta(this,local_34);
  if (local_30 == (Meta *)0x0) {
    pDStack_10 = (Decoration *)&this->empty_string;
  }
  else {
    uVar1 = (ulong)m._4_4_;
    sVar2 = VectorView<spirv_cross::Meta::Decoration>::size
                      (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>);
    if (uVar1 < sVar2) {
      pDStack_10 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                             (&(local_30->members).super_VectorView<spirv_cross::Meta::Decoration>,
                              (ulong)m._4_4_);
    }
    else {
      pDStack_10 = (Decoration *)&this->empty_string;
    }
  }
  return &pDStack_10->alias;
}

Assistant:

const string &ParsedIR::get_member_name(TypeID id, uint32_t index) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (index >= m->members.size())
			return empty_string;
		return m->members[index].alias;
	}
	else
		return empty_string;
}